

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<double> *target,string_view name,
          string_view value)

{
  optional<double> oVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  oVar1 = parseDouble(name,value,__return_storage_ptr__);
  (target->super__Optional_base<double,_true,_true>)._M_payload.super__Optional_payload_base<double>
  ._M_payload = oVar1.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
  (target->super__Optional_base<double,_true,_true>)._M_payload.super__Optional_payload_base<double>
  ._M_engaged = oVar1.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_engaged;
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<double>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseDouble(name, value, error);
    return error;
}